

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

bool R_PlaneInitData(void)

{
  visplane_s *pvVar1;
  visplane_t *next_1;
  visplane_t *next;
  visplane_t *pl;
  int i;
  
  next = freetail;
  while (next != (visplane_t *)0x0) {
    pvVar1 = next->next;
    M_Free(next);
    next = pvVar1;
  }
  freetail = (visplane_t *)0x0;
  freehead = &freetail;
  for (pl._4_4_ = 0; pl._4_4_ < 0x80; pl._4_4_ = pl._4_4_ + 1) {
    next = visplanes[pl._4_4_];
    visplanes[pl._4_4_] = (visplane_t *)0x0;
    while (next != (visplane_t *)0x0) {
      pvVar1 = next->next;
      M_Free(next);
      next = pvVar1;
    }
  }
  return true;
}

Assistant:

bool R_PlaneInitData ()
{
	int i;
	visplane_t *pl;

	// Free all visplanes and let them be re-allocated as needed.
	pl = freetail;

	while (pl)
	{
		visplane_t *next = pl->next;
		M_Free (pl);
		pl = next;
	}
	freetail = NULL;
	freehead = &freetail;

	for (i = 0; i < MAXVISPLANES; i++)
	{
		pl = visplanes[i];
		visplanes[i] = NULL;
		while (pl)
		{
			visplane_t *next = pl->next;
			M_Free (pl);
			pl = next;
		}
	}

	return true;
}